

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

int __thiscall
vkt::tessellation::anon_unknown_1::IOBlock::numBasicSubobjectsInElementType(IOBlock *this)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  int local_18;
  int local_14;
  int i;
  int result;
  IOBlock *this_local;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    sVar2 = std::
            vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
            ::size(&this->m_members);
    if ((int)sVar2 <= local_18) break;
    pvVar3 = std::
             vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
             ::operator[](&this->m_members,(long)local_18);
    iVar1 = numBasicSubobjects(&pvVar3->type);
    local_14 = iVar1 + local_14;
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

int IOBlock::numBasicSubobjectsInElementType (void) const
{
	int result = 0;
	for (int i = 0; i < static_cast<int>(m_members.size()); ++i)
		result += numBasicSubobjects(m_members[i].type);
	return result;
}